

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableView::timerEvent(QTableView *this,QTimerEvent *event)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  QWidget *this_00;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  LayoutDirection LVar10;
  QScrollBar *pQVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long in_FS_OFFSET;
  bool bVar16;
  int iVar17;
  Representation RVar18;
  QRect QVar19;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  iVar5 = *(int *)(event + 0x10);
  if (iVar5 != *(int *)(lVar3 + 0x548)) goto LAB_0058b6d4;
  pQVar11 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
  iVar5 = QAbstractSlider::maximum(&pQVar11->super_QAbstractSlider);
  lVar14 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                     super_QWidget;
  if (*(int *)(*(long *)(*(long *)(*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                             field_0x8 + 0x580) + 8) + 0x540) == 1) {
    (**(code **)(lVar14 + 0x260))(this);
  }
  else {
    (**(code **)(lVar14 + 0x268))(this);
    QBasicTimer::stop();
  }
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_48.x2.m_i = -1;
  local_48.y2.m_i = -1;
  lVar14 = *(long *)(*(long *)(lVar3 + 0x2b0) + 0x20);
  uVar1 = *(undefined8 *)(lVar14 + 0x1c);
  uVar2 = *(undefined8 *)(lVar14 + 0x14);
  iVar17 = (int)uVar1 - (int)uVar2;
  RVar18.m_i = (int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20);
  if (*(long *)(lVar3 + 0x650) == lVar3 + 0x650) {
    pQVar11 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    iVar6 = QAbstractSlider::value(&pQVar11->super_QAbstractSlider);
    QVar19.x2.m_i = local_48.x2.m_i;
    QVar19.y2.m_i = local_48.y2.m_i;
    QVar19.x1.m_i = local_48.x1.m_i;
    QVar19.y1.m_i = local_48.y1.m_i;
    if (iVar6 == iVar5) goto LAB_0058b687;
    uVar9 = *(int *)(lVar3 + 0x560) - 1;
    if (-1 < (int)uVar9) {
      lVar14 = (ulong)uVar9 + 1;
      do {
        iVar5 = *(int *)(*(long *)(lVar3 + 0x558) + -4 + lVar14 * 4);
        local_48 = QVar19;
        uVar9 = QHeaderView::sectionViewportPosition
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x580),iVar5);
        LVar10 = QWidget::layoutDirection((QWidget *)this);
        if (LVar10 == RightToLeft) {
          iVar5 = QHeaderView::sectionSize
                            (*(QHeaderView **)
                              (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                         super_QFrame.super_QWidget.field_0x8 + 0x580),iVar5);
          local_58.x1.m_i = 0;
          local_58.y1.m_i = 0;
          local_58.x2.m_i = iVar5 + uVar9 + -1;
        }
        else {
          local_58.y1.m_i = 0;
          local_58.x1.m_i = uVar9;
          local_58.x2.m_i = iVar17;
        }
        local_58.y2.m_i = RVar18.m_i;
        QVar19 = (QRect)QRect::operator|(&local_48,&local_58);
        lVar15 = lVar14 + -1;
        bVar16 = 0 < lVar14;
        lVar14 = lVar15;
      } while (lVar15 != 0 && bVar16);
    }
  }
  else {
LAB_0058b687:
    auVar4._4_4_ = RVar18.m_i;
    auVar4._0_4_ = iVar17;
    auVar4._8_8_ = 0;
    QVar19 = (QRect)(auVar4 << 0x40);
  }
  this_00 = *(QWidget **)(lVar3 + 0x2b0);
  local_48 = QVar19;
  local_58 = (QRect)QRect::normalized();
  QWidget::update(this_00,&local_58);
  QList<int>::clear((QList<int> *)(lVar3 + 0x550));
  iVar5 = *(int *)(event + 0x10);
LAB_0058b6d4:
  if (iVar5 == *(int *)(lVar3 + 0x54c)) {
    pQVar11 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    iVar5 = QAbstractSlider::maximum(&pQVar11->super_QAbstractSlider);
    lVar14 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                       super_QWidget;
    if (*(int *)(*(long *)(*(long *)(*(long *)&(this->super_QAbstractItemView).
                                               super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                               field_0x8 + 0x588) + 8) + 0x540) == 1) {
      (**(code **)(lVar14 + 0x260))(this);
    }
    else {
      (**(code **)(lVar14 + 0x268))(this);
      QBasicTimer::stop();
    }
    lVar14 = *(long *)(*(long *)(lVar3 + 0x2b0) + 0x20);
    RVar18.m_i = *(int *)(lVar14 + 0x20) - *(int *)(lVar14 + 0x18);
    uVar12 = RVar18.m_i + 1;
    iVar17 = *(int *)(lVar14 + 0x14);
    iVar6 = *(int *)(lVar14 + 0x1c);
    uVar9 = 0;
    if (*(long *)(lVar3 + 0x650) == lVar3 + 0x650) {
      pQVar11 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar7 = QAbstractSlider::value(&pQVar11->super_QAbstractSlider);
      uVar9 = 0;
      if ((iVar7 != iVar5) && (uVar8 = *(int *)(lVar3 + 0x578) - 1, uVar9 = uVar12, -1 < (int)uVar8)
         ) {
        uVar13 = (ulong)uVar8;
        do {
          uVar12 = QHeaderView::sectionViewportPosition
                             (*(QHeaderView **)
                               (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                          super_QFrame.super_QWidget.field_0x8 + 0x588),
                              *(int *)(*(long *)(lVar3 + 0x570) + uVar13 * 4));
          if ((int)uVar12 <= (int)uVar9) {
            uVar9 = uVar12;
          }
          bVar16 = uVar13 != 0;
          uVar13 = uVar13 - 1;
        } while (bVar16);
      }
    }
    local_48._0_8_ = (ulong)uVar9 << 0x20;
    local_48.y2.m_i = RVar18.m_i;
    local_48.x2.m_i = iVar6 - iVar17;
    QWidget::update(*(QWidget **)(lVar3 + 0x2b0),&local_48);
    QList<int>::clear((QList<int> *)(lVar3 + 0x568));
  }
  QAbstractItemView::timerEvent((QAbstractItemView *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::timerEvent(QTimerEvent *event)
{
    Q_D(QTableView);

    if (event->id() == d->columnResizeTimer.id()) {
        const int oldScrollMax = horizontalScrollBar()->maximum();
        if (horizontalHeader()->d_func()->state != QHeaderViewPrivate::ResizeSection) {
            updateGeometries();
            d->columnResizeTimer.stop();
        } else {
            updateEditorGeometries();
        }

        QRect rect;
        int viewportHeight = d->viewport->height();
        int viewportWidth = d->viewport->width();
        if (d->hasSpans() || horizontalScrollBar()->value() == oldScrollMax) {
            rect = QRect(0, 0, viewportWidth, viewportHeight);
        } else {
            for (int i = d->columnsToUpdate.size()-1; i >= 0; --i) {
                int column = d->columnsToUpdate.at(i);
                int x = columnViewportPosition(column);
                if (isRightToLeft())
                    rect |= QRect(0, 0, x + columnWidth(column), viewportHeight);
                else
                    rect |= QRect(x, 0, viewportWidth - x, viewportHeight);
            }
        }

        d->viewport->update(rect.normalized());
        d->columnsToUpdate.clear();
    }

    if (event->id() == d->rowResizeTimer.id()) {
        const int oldScrollMax = verticalScrollBar()->maximum();
        if (verticalHeader()->d_func()->state != QHeaderViewPrivate::ResizeSection) {
            updateGeometries();
            d->rowResizeTimer.stop();
        } else {
            updateEditorGeometries();
        }

        int viewportHeight = d->viewport->height();
        int viewportWidth = d->viewport->width();
        int top;
        if (d->hasSpans() || verticalScrollBar()->value() == oldScrollMax) {
            top = 0;
        } else {
            top = viewportHeight;
            for (int i = d->rowsToUpdate.size()-1; i >= 0; --i) {
                int y = rowViewportPosition(d->rowsToUpdate.at(i));
                top = qMin(top, y);
            }
        }

        d->viewport->update(QRect(0, top, viewportWidth, viewportHeight - top));
        d->rowsToUpdate.clear();
    }

    QAbstractItemView::timerEvent(event);
}